

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_mset.pb.cc
# Opt level: O0

void proto2_unittest::NestedTestMessageSetContainer::SharedDtor(MessageLite *self)

{
  TestMessageSetContainer *this;
  NestedTestMessageSetContainer *pNVar1;
  Arena *pAVar2;
  LogMessage *pLVar3;
  LogMessage local_30;
  Voidify local_19;
  MessageLite *local_18;
  NestedTestMessageSetContainer *this_;
  MessageLite *self_local;
  
  local_18 = self;
  this_ = (NestedTestMessageSetContainer *)self;
  google::protobuf::internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>
            (&self->_internal_metadata_);
  pAVar2 = google::protobuf::MessageLite::GetArena(local_18);
  if (pAVar2 == (Arena *)0x0) {
    this = (TestMessageSetContainer *)local_18[1]._internal_metadata_.ptr_;
    if (this != (TestMessageSetContainer *)0x0) {
      TestMessageSetContainer::~TestMessageSetContainer(this);
      operator_delete(this,0x20);
    }
    pNVar1 = (NestedTestMessageSetContainer *)local_18[2]._vptr_MessageLite;
    if (pNVar1 != (NestedTestMessageSetContainer *)0x0) {
      ~NestedTestMessageSetContainer(pNVar1);
      operator_delete(pNVar1,0x30);
    }
    pNVar1 = (NestedTestMessageSetContainer *)local_18[2]._internal_metadata_.ptr_;
    if (pNVar1 != (NestedTestMessageSetContainer *)0x0) {
      ~NestedTestMessageSetContainer(pNVar1);
      operator_delete(pNVar1,0x30);
    }
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/google/protobuf/unittest_mset.pb.cc"
             ,0x2d8,"this_.GetArena() == nullptr");
  pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar3);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

inline void NestedTestMessageSetContainer::SharedDtor(MessageLite& self) {
  NestedTestMessageSetContainer& this_ = static_cast<NestedTestMessageSetContainer&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  delete this_._impl_.container_;
  delete this_._impl_.child_;
  delete this_._impl_.lazy_child_;
  this_._impl_.~Impl_();
}